

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

void __thiscall QFile::QFile(QFile *this,QString *name,QObject *parent)

{
  QFileDevicePrivate *dd;
  QFilePrivate *in_RDI;
  QFilePrivate *d;
  QString *in_stack_ffffffffffffffb8;
  QFileDevice *in_stack_ffffffffffffffd0;
  
  dd = (QFileDevicePrivate *)operator_new(0x1c0);
  QFilePrivate::QFilePrivate(in_RDI);
  QFileDevice::QFileDevice(in_stack_ffffffffffffffd0,dd,(QObject *)in_RDI);
  (in_RDI->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.
  _vptr_QObjectData = (_func_int **)&PTR_metaObject_00be2908;
  d_func((QFile *)0x2a2af9);
  QString::operator=((QString *)in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

QFile::QFile(const QString &name, QObject *parent)
    : QFileDevice(*new QFilePrivate, parent)
{
    Q_D(QFile);
    d->fileName = name;
}